

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

int Cec2_ManSimHashKey(word *pSim,int nSims,int nTableSize)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = nSims * 2;
  if ((*pSim & 1) == 0) {
    if (0 < nSims) {
      uVar2 = 1;
      if (1 < (int)uVar1) {
        uVar2 = (ulong)uVar1;
      }
      uVar3 = 0;
      uVar1 = 0;
      do {
        uVar1 = uVar1 ^ Cec2_ManSimHashKey::s_Primes[(uint)uVar3 & 0xf] *
                        *(int *)((long)pSim + uVar3 * 4);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      goto LAB_00646df1;
    }
  }
  else if (0 < nSims) {
    uVar2 = 1;
    if (1 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    uVar3 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 ^ ~*(uint *)((long)pSim + uVar3 * 4) *
                      Cec2_ManSimHashKey::s_Primes[(uint)uVar3 & 0xf];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    goto LAB_00646df1;
  }
  uVar1 = 0;
LAB_00646df1:
  return uVar1 % (uint)nTableSize;
}

Assistant:

int Cec2_ManSimHashKey( word * pSim, int nSims, int nTableSize )
{
    static int s_Primes[16] = { 
        1291, 1699, 1999, 2357, 2953, 3313, 3907, 4177, 
        4831, 5147, 5647, 6343, 6899, 7103, 7873, 8147 };
    unsigned uHash = 0, * pSimU = (unsigned *)pSim;
    int i, nSimsU = 2 * nSims;
    if ( pSimU[0] & 1 )
        for ( i = 0; i < nSimsU; i++ )
            uHash ^= ~pSimU[i] * s_Primes[i & 0xf];
    else
        for ( i = 0; i < nSimsU; i++ )
            uHash ^= pSimU[i] * s_Primes[i & 0xf];
    return (int)(uHash % nTableSize);

}